

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# price_update_decoder_test.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::price::pixie::PriceUpdateDecoderTest_test_decode_double_field_Test::TestBody
          (PriceUpdateDecoderTest_test_decode_double_field_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_e0;
  Message local_d8;
  double local_d0;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar_1;
  Message local_b0;
  Type local_a8 [2];
  undefined1 local_a0 [8];
  AssertionResult gtest_ar;
  PriceField field;
  allocator<char> local_69;
  string local_68 [32];
  FieldDef local_48 [8];
  FieldDef field_def;
  double local_18;
  double value;
  PriceUpdateDecoderTest_test_decode_double_field_Test *this_local;
  
  local_18 = 34892343.2132;
  value = (double)this;
  bidfx_public_api::tools::ByteBuffer::WriteDouble(34892343.2132);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_68,"field",&local_69);
  bidfx_public_api::price::pixie::FieldDef::FieldDef(local_48,1,0x44,local_68);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator(&local_69);
  bidfx_public_api::price::pixie::PriceUpdateDecoder::DecodeField
            ((ByteBuffer *)&gtest_ar.message_,
             (FieldDef *)&(this->super_PriceUpdateDecoderTest).buffer);
  local_a8[1] = 2;
  local_a8[0] = bidfx_public_api::price::PriceField::GetType();
  testing::internal::EqHelper<false>::
  Compare<bidfx_public_api::price::PriceField::Type,bidfx_public_api::price::PriceField::Type>
            ((EqHelper<false> *)local_a0,"PriceField::DOUBLE","field.GetType()",local_a8 + 1,
             local_a8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a0);
  if (!bVar1) {
    testing::Message::Message(&local_b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/price_update_decoder_test.cpp"
               ,0x21,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a0);
  local_d0 = (double)bidfx_public_api::price::PriceField::GetDouble();
  testing::internal::EqHelper<false>::Compare<double,double>
            ((EqHelper<false> *)local_c8,"value","field.GetDouble()",&local_18,&local_d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
  if (!bVar1) {
    testing::Message::Message(&local_d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c8);
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/price_update_decoder_test.cpp"
               ,0x22,pcVar2);
    testing::internal::AssertHelper::operator=(&local_e0,&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    testing::Message::~Message(&local_d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
  bidfx_public_api::price::PriceField::~PriceField((PriceField *)&gtest_ar.message_);
  FieldDef::~FieldDef(local_48);
  return;
}

Assistant:

TEST_F(PriceUpdateDecoderTest, test_decode_double_field)
{
    double value = 34892343.2132;
    buffer.WriteDouble(value);
    FieldDef field_def = FieldDef(1, FieldTypeEnum::DOUBLE, "field");
    PriceField field = PriceUpdateDecoder::DecodeField(buffer, field_def);
    EXPECT_EQ(PriceField::DOUBLE, field.GetType());
    EXPECT_EQ(value, field.GetDouble());
}